

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_sqr(secp256k1_fe *r,secp256k1_fe *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  uint64_t uVar102;
  uint64_t uVar103;
  uint64_t uVar104;
  uint64_t uVar105;
  int iVar106;
  int iVar107;
  ulong uVar108;
  ulong uVar109;
  ulong uVar110;
  secp256k1_fe *a_00;
  secp256k1_fe *a_01;
  ulong uVar111;
  secp256k1_fe *a_02;
  secp256k1_gej *a_03;
  ulong uVar112;
  secp256k1_fe *a_04;
  secp256k1_fe *a_05;
  secp256k1_gej *r_00;
  ulong uVar113;
  undefined1 auVar114 [16];
  
  secp256k1_fe_verify(a);
  a_04 = (secp256k1_fe *)(ulong)(uint)a->magnitude;
  a_02 = (secp256k1_fe *)0x8;
  secp256k1_fe_verify_magnitude(a_04,8);
  uVar108 = a->n[0];
  if (uVar108 >> 0x38 == 0) {
    a_02 = (secp256k1_fe *)a->n[1];
    if ((secp256k1_fe *)0xffffffffffffff < a_02) goto LAB_001158b4;
    uVar110 = a->n[2];
    if (0xffffffffffffff < uVar110) goto LAB_001158b9;
    uVar111 = a->n[3];
    if (0xffffffffffffff < uVar111) goto LAB_001158be;
    uVar112 = a->n[4];
    if (uVar112 >> 0x34 == 0) {
      uVar109 = uVar108 * 2;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar111;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar109;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar110;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = (long)a_02 * 2;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar112;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar112;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = SUB168(auVar6 * auVar58,0);
      auVar26 = auVar5 * auVar57 + auVar4 * auVar56 + auVar7 * ZEXT816(0x1000003d10);
      uVar112 = uVar112 * 2;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar112;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar108;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar111;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = (long)a_02 * 2;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar110;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar110;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = SUB168(auVar6 * auVar58,8);
      auVar114 = auVar11 * ZEXT816(0x1000003d10000) +
                 auVar8 * auVar59 + auVar10 * auVar61 + auVar9 * auVar60 + (auVar26 >> 0x34);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar108;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar108;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar112;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = a_02;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar111;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = uVar110 * 2;
      auVar25 = auVar14 * auVar64 + auVar13 * auVar63 + (auVar114 >> 0x34);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = (auVar25._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar114._6_2_ & 0xf);
      auVar27 = auVar15 * ZEXT816(0x1000003d1) + auVar12 * auVar62;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = a_02;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = uVar109;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar112;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = uVar110;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar111;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = uVar111;
      auVar25 = auVar18 * auVar67 + auVar17 * auVar66 + (auVar25 >> 0x34);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = auVar25._0_8_ & 0xfffffffffffff;
      auVar28 = (auVar27 >> 0x34) + auVar19 * ZEXT816(0x1000003d10) + auVar16 * auVar65;
      uVar108 = auVar28._0_8_;
      uVar113 = auVar28._8_8_;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar110;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = uVar109;
      auVar96._8_8_ = uVar113 >> 0x34;
      auVar96._0_8_ = uVar113 * 0x1000 | uVar108 >> 0x34;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = a_02;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = a_02;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar112;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = uVar111;
      auVar25 = auVar22 * auVar70 + (auVar25 >> 0x34);
      r->n[0] = auVar27._0_8_ & 0xfffffffffffff;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = auVar25._0_8_;
      r->n[1] = uVar108 & 0xfffffffffffff;
      auVar96 = auVar23 * ZEXT816(0x1000003d10) + auVar21 * auVar69 + auVar20 * auVar68 + auVar96;
      auVar27 = auVar96 >> 0x34;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = auVar27._0_8_;
      auVar97._8_8_ = auVar27._8_8_;
      auVar97._0_8_ = auVar26._0_8_ & 0xffffffffffffe;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = auVar25._8_8_;
      r->n[2] = auVar96._0_8_ & 0xfffffffffffff;
      auVar98 = auVar24 * ZEXT816(0x1000003d10000) + auVar97 + auVar98;
      uVar108 = auVar98._0_8_;
      r->n[3] = uVar108 & 0xfffffffffffff;
      r->n[4] = (auVar98._8_8_ << 0xc | uVar108 >> 0x34) + (auVar114._0_8_ & 0xffffffffffff);
      r->magnitude = 1;
      r->normalized = 0;
      secp256k1_fe_verify(r);
      return;
    }
  }
  else {
    secp256k1_fe_sqr_cold_5();
LAB_001158b4:
    secp256k1_fe_sqr_cold_4();
LAB_001158b9:
    secp256k1_fe_sqr_cold_3();
LAB_001158be:
    secp256k1_fe_sqr_cold_2();
  }
  secp256k1_fe_sqr_cold_1();
  secp256k1_fe_verify(a_02);
  secp256k1_fe_verify(a_00);
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)a_02->magnitude,8);
  a_05 = (secp256k1_fe *)(ulong)(uint)a_00->magnitude;
  uVar108 = 8;
  secp256k1_fe_verify_magnitude(a_05,8);
  if (a_04 == a_00) {
    secp256k1_fe_mul_cold_16();
LAB_00115de3:
    secp256k1_fe_mul_cold_15();
LAB_00115de8:
    secp256k1_fe_mul_cold_14();
LAB_00115ded:
    secp256k1_fe_mul_cold_13();
LAB_00115df2:
    secp256k1_fe_mul_cold_12();
LAB_00115df7:
    secp256k1_fe_mul_cold_11();
LAB_00115dfc:
    secp256k1_fe_mul_cold_10();
LAB_00115e01:
    secp256k1_fe_mul_cold_9();
LAB_00115e06:
    secp256k1_fe_mul_cold_8();
LAB_00115e0b:
    secp256k1_fe_mul_cold_7();
LAB_00115e10:
    secp256k1_fe_mul_cold_6();
LAB_00115e15:
    secp256k1_fe_mul_cold_5();
    auVar114._8_8_ = uVar108;
    auVar114._0_8_ = a_05;
LAB_00115e1a:
    secp256k1_fe_mul_cold_4();
LAB_00115e1f:
    secp256k1_fe_mul_cold_3();
  }
  else {
    if (a_02 == a_00) goto LAB_00115de3;
    uVar110 = a_02->n[0];
    if (uVar110 >> 0x38 != 0) goto LAB_00115de8;
    uVar111 = a_02->n[1];
    if (0xffffffffffffff < uVar111) goto LAB_00115ded;
    a_05 = (secp256k1_fe *)a_02->n[2];
    if ((secp256k1_fe *)0xffffffffffffff < a_05) goto LAB_00115df2;
    uVar112 = a_02->n[3];
    if (0xffffffffffffff < uVar112) goto LAB_00115df7;
    uVar108 = a_02->n[4];
    if (uVar108 >> 0x34 != 0) goto LAB_00115dfc;
    uVar109 = a_00->n[0];
    if (0xffffffffffffff < uVar109) goto LAB_00115e01;
    uVar113 = a_00->n[1];
    if (0xffffffffffffff < uVar113) goto LAB_00115e06;
    uVar1 = a_00->n[2];
    if (0xffffffffffffff < uVar1) goto LAB_00115e0b;
    uVar2 = a_00->n[3];
    if (0xffffffffffffff < uVar2) goto LAB_00115e10;
    uVar3 = a_00->n[4];
    if (0xfffffffffffff < uVar3) goto LAB_00115e15;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar2;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar110;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar1;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar111;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar113;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = a_05;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar109;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar112;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar3;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar108;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = SUB168(auVar29 * auVar75,0);
    auVar25 = auVar30 * ZEXT816(0x1000003d10) +
              auVar25 * auVar71 + auVar26 * auVar72 + auVar28 * auVar74 + auVar27 * auVar73;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar3;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar110;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar2;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar111;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar1;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = a_05;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar113;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar112;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar109;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar108;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = SUB168(auVar29 * auVar75,8);
    auVar26 = auVar36 * ZEXT816(0x1000003d10000) +
              auVar31 * auVar76 +
              auVar32 * auVar77 + auVar33 * auVar78 + auVar35 * auVar80 + auVar34 * auVar79 +
              (auVar25 >> 0x34);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar109;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar110;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar3;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar111;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar2;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = a_05;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar1;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar112;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar113;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar108;
    auVar114 = (auVar26 >> 0x34) +
               auVar38 * auVar82 + auVar39 * auVar83 + auVar41 * auVar85 + auVar40 * auVar84;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = auVar114._0_8_ * 0x10 & 0xfffffffffffff0U | (ulong)(auVar26._6_2_ & 0xf);
    auVar27 = auVar42 * ZEXT816(0x1000003d1) + auVar37 * auVar81;
    uVar109 = auVar27._0_8_;
    uVar113 = auVar27._8_8_;
    a_04->n[0] = uVar109 & 0xfffffffffffff;
    auVar99._8_8_ = uVar113 >> 0x34;
    auVar99._0_8_ = uVar113 * 0x1000 | uVar109 >> 0x34;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar110;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = a_00->n[1];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar111;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = a_00->n[0];
    auVar27 = auVar43 * auVar86 + auVar99 + auVar44 * auVar87;
    if (auVar27._8_8_ >> 0x32 != 0) goto LAB_00115e1a;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = a_05;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = a_00->n[4];
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar112;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = a_00->n[3];
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar108;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = a_00->n[2];
    auVar28 = auVar47 * auVar90 + auVar45 * auVar88 + (auVar114 >> 0x34) + auVar46 * auVar89;
    uVar109 = auVar28._8_8_;
    auVar114._8_8_ = uVar109;
    auVar114._0_8_ = 0xffffffffffffffff;
    if (0x3ffffffffffff < uVar109) goto LAB_00115e1f;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = auVar28._0_8_ & 0xfffffffffffff;
    auVar27 = auVar27 + auVar48 * ZEXT816(0x1000003d10);
    auVar114._0_8_ = a_04;
    a_04->n[1] = auVar27._0_8_ & 0xfffffffffffff;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar110;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = a_00->n[2];
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar111;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = a_00->n[1];
    auVar51._8_8_ = 0;
    auVar51._0_8_ = a_05;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = a_00->n[0];
    auVar27 = auVar49 * auVar91 + (auVar27 >> 0x34) + auVar50 * auVar92 + auVar51 * auVar93;
    if (auVar27._8_8_ < 0x4000000000000) {
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar112;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = a_00->n[4];
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar108;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = a_00->n[3];
      auVar28 = auVar52 * auVar94 + (auVar28 >> 0x34) + auVar53 * auVar95;
      uVar108 = auVar28._8_8_;
      auVar114._8_8_ = uVar108;
      if (uVar108 < 0x4000000000000) {
        auVar54._8_8_ = 0;
        auVar54._0_8_ = auVar28._0_8_;
        auVar27 = auVar27 + auVar54 * ZEXT816(0x1000003d10);
        auVar114 = auVar27 >> 0x34;
        auVar101._8_8_ = 0;
        auVar101._0_8_ = auVar114._0_8_;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = uVar108;
        auVar100._8_8_ = auVar114._8_8_;
        auVar100._0_8_ = auVar25._0_8_ & 0xfffffffffffff;
        a_04->n[2] = auVar27._0_8_ & 0xfffffffffffff;
        auVar101 = auVar55 * ZEXT816(0x1000003d10000) + auVar100 + auVar101;
        uVar108 = auVar101._0_8_;
        a_04->n[3] = uVar108 & 0xfffffffffffff;
        a_04->n[4] = (auVar101._8_8_ << 0xc | uVar108 >> 0x34) + (auVar26._0_8_ & 0xffffffffffff);
        a_04->magnitude = 1;
        a_04->normalized = 0;
        secp256k1_fe_verify(a_04);
        return;
      }
      goto LAB_00115e29;
    }
  }
  secp256k1_fe_mul_cold_2();
LAB_00115e29:
  secp256k1_fe_mul_cold_1();
  a_03 = auVar114._8_8_;
  r_00 = auVar114._0_8_;
  secp256k1_gej_verify(a_03);
  if (a_03->infinity == 0) {
    if (a_01 != (secp256k1_fe *)0x0) {
      uVar102 = (a_03->y).n[0];
      uVar103 = (a_03->y).n[1];
      uVar104 = (a_03->y).n[2];
      uVar105 = (a_03->y).n[3];
      iVar106 = (a_03->y).magnitude;
      iVar107 = (a_03->y).normalized;
      a_01->n[4] = (a_03->y).n[4];
      a_01->magnitude = iVar106;
      a_01->normalized = iVar107;
      a_01->n[2] = uVar104;
      a_01->n[3] = uVar105;
      a_01->n[0] = uVar102;
      a_01->n[1] = uVar103;
      secp256k1_fe_verify(a_01);
      uVar108 = a_01->n[4];
      uVar111 = (uVar108 >> 0x30) * 0x1000003d1 + a_01->n[0];
      uVar110 = (uVar111 >> 0x34) + a_01->n[1];
      uVar112 = (uVar110 >> 0x34) + a_01->n[2];
      uVar109 = (uVar112 >> 0x34) + a_01->n[3];
      a_01->n[0] = uVar111 & 0xfffffffffffff;
      a_01->n[1] = uVar110 & 0xfffffffffffff;
      a_01->n[2] = uVar112 & 0xfffffffffffff;
      a_01->n[3] = uVar109 & 0xfffffffffffff;
      a_01->n[4] = (uVar109 >> 0x34) + (uVar108 & 0xffffffffffff);
      a_01->magnitude = 1;
      secp256k1_fe_verify(a_01);
    }
    secp256k1_gej_double(r_00,a_03);
    secp256k1_gej_verify(r_00);
    return;
  }
  secp256k1_gej_set_infinity(r_00);
  if (a_01 != (secp256k1_fe *)0x0) {
    a_01->n[0] = 1;
    a_01->n[1] = 0;
    a_01->n[2] = 0;
    a_01->n[3] = 0;
    a_01->n[4] = 0;
    a_01->magnitude = 1;
    a_01->normalized = 1;
    secp256k1_fe_verify(a_01);
    return;
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_sqr(secp256k1_fe *r, const secp256k1_fe *a) {
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 8);

    secp256k1_fe_impl_sqr(r, a);
    r->magnitude = 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}